

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 extraout_RAX;
  Emulator emu;
  Emulator local_11a0;
  
  if (argc == 2) {
    printf("Loading %s\n",argv[1]);
    Emulator::Emulator(&local_11a0,argv[1]);
    Emulator::run(&local_11a0,3000);
    puts("DONE");
    Emulator::~Emulator(&local_11a0);
    return 0;
  }
  main_cold_1();
  Emulator::~Emulator(&local_11a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv){
	if (argc != 2){
		fprintf(stderr, "Usage: %s romfile\n", argv[0]);
		exit(EXIT_FAILURE);
	}
	
	printf("Loading %s\n", argv[1]);

	Emulator emu(argv[1]);
	emu.run(3000); // This can be changed for faster or slower game
	printf("DONE\n");
}